

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adventurer.cpp
# Opt level: O0

void __thiscall despot::Adventurer::PrintState(Adventurer *this,State *s,ostream *out)

{
  const_reference pvVar1;
  int local_4c;
  char local_48 [4];
  int x;
  char buffer [20];
  AdventurerState *state;
  ostream *out_local;
  State *s_local;
  Adventurer *this_local;
  
  for (local_4c = 0; local_4c < this->size_; local_4c = local_4c + 1) {
    if (local_4c == this->size_ + -1) {
      if (*(int *)(s + 0xc) % this->size_ == local_4c) {
        sprintf(local_48,"%s%-2.2d","T",(long)*(int *)(s + 0xc) / (long)this->size_ & 0xffffffff);
        std::operator<<(out,local_48);
      }
      else {
        sprintf(local_48,"%s%-2.2d","G",(long)*(int *)(s + 0xc) / (long)this->size_ & 0xffffffff);
        std::operator<<(out,local_48);
      }
    }
    else if (*(int *)(s + 0xc) % this->size_ == local_4c) {
      std::operator<<(out,"R     ");
    }
    else {
      pvVar1 = std::vector<double,_std::allocator<double>_>::operator[]
                         (&this->trap_prob_,(long)local_4c);
      sprintf(local_48,"%4.3f ",*pvVar1);
      std::operator<<(out,local_48);
    }
  }
  std::ostream::operator<<(out,std::endl<char,std::char_traits<char>>);
  return;
}

Assistant:

void Adventurer::PrintState(const State& s, ostream& out) const {
	const AdventurerState& state = static_cast<const AdventurerState&>(s);

	char buffer[20];
	for (int x = 0; x < size_; x++) {
		if (x == size_ - 1) {
			if (state.state_id % size_ == x) {
				sprintf(buffer, "%s%-2.2d", "T", state.state_id / size_);
				out << buffer;
			} else {
				sprintf(buffer, "%s%-2.2d", "G", state.state_id / size_);
				out << buffer;
			}
		} else {
			if (state.state_id % size_ == x)
				out << "R     ";
			else {
				sprintf(buffer, "%4.3f ", trap_prob_[x]);
				out << buffer;
			}
		}
	}
	out << endl;
}